

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcanpty.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int __fd;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  undefined8 *in_RSI;
  int in_EDI;
  fd_set *__arr;
  uint __i;
  char *name_pts;
  can_filter fi;
  int is_open;
  int tstamp;
  int running;
  int select_stdin;
  termios topts;
  sockaddr_can addr;
  int s;
  int p;
  fd_set rdfs;
  char *in_stack_fffffffffffffed0;
  uint local_11c;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  uint in_stack_ffffffffffffff14;
  tcflag_t in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff40;
  speed_t in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined2 uVar11;
  int pty;
  fd_set local_90;
  undefined8 *local_10;
  int local_4;
  
  uVar11 = SUB42(in_stack_ffffffffffffff50,2);
  local_4 = 0;
  iVar10 = 1;
  uVar9 = 0;
  uVar8 = 0;
  if (in_EDI == 3) {
    local_10 = in_RSI;
    iVar1 = check_select_stdin();
    __fd = open((char *)local_10[1],2);
    if (__fd < 0) {
      perror("open pty");
      local_4 = 1;
    }
    else {
      iVar2 = tcgetattr(__fd,(termios *)&stack0xffffffffffffff14);
      if (iVar2 == 0) {
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 & 0xfffff385;
        uVar3 = in_stack_ffffffffffffff14 & 0xfffffeff | 0x40;
        tcsetattr(__fd,0,(termios *)&stack0xffffffffffffff14);
        iVar2 = strcmp((char *)local_10[1],"/dev/ptmx");
        if (iVar2 == 0) {
          iVar2 = grantpt(__fd);
          if (iVar2 < 0) {
            perror("grantpt");
            return 1;
          }
          iVar2 = unlockpt(__fd);
          if (iVar2 < 0) {
            perror("unlockpt");
            return 1;
          }
          pcVar6 = ptsname(__fd);
          if (pcVar6 == (char *)0x0) {
            perror("ptsname");
            return 1;
          }
          printf("open: %s: slave pseudo-terminal is %s\n",local_10[1],pcVar6);
        }
        iVar2 = socket(0x1d,3,1);
        if (iVar2 < 0) {
          perror("socket");
          local_4 = 1;
        }
        else {
          pty = CONCAT22(uVar11,0x1d);
          uVar4 = if_nametoindex((char *)local_10[2]);
          if (uVar4 == 0) {
            perror("if_nametoindex");
            local_4 = 1;
          }
          else {
            setsockopt(iVar2,0x65,1,(void *)0x0,0);
            iVar5 = bind(iVar2,(sockaddr *)&stack0xffffffffffffff50,0x18);
            if (iVar5 < 0) {
              perror("bind");
              local_4 = 1;
            }
            else {
              uVar7 = 0;
              while (iVar10 != 0) {
                for (local_11c = 0; local_11c < 0x10; local_11c = local_11c + 1) {
                  local_90.fds_bits[local_11c] = 0;
                }
                if (iVar1 != 0) {
                  local_90.fds_bits[0] = local_90.fds_bits[0] | 1;
                }
                local_90.fds_bits[__fd / 0x40] =
                     1L << ((byte)((long)__fd % 0x40) & 0x3f) | local_90.fds_bits[__fd / 0x40];
                local_90.fds_bits[iVar2 / 0x40] =
                     1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | local_90.fds_bits[iVar2 / 0x40];
                iVar5 = select(iVar2 + 1,&local_90,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
                if (iVar5 < 0) {
                  perror("select");
                  return 1;
                }
                if ((local_90.fds_bits[0] & 1U) == 0) {
                  if (((local_90.fds_bits[__fd / 0x40] & 1L << ((byte)((long)__fd % 0x40) & 0x3f))
                       == 0) ||
                     (iVar5 = pty2can(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                      (can_filter *)CONCAT44(uVar3,iVar1),
                                      (int *)CONCAT44(iVar10,uVar9),(int *)CONCAT44(uVar8,uVar7)),
                     iVar5 == 0)) {
                    if (((local_90.fds_bits[iVar2 / 0x40] &
                         1L << ((byte)((long)iVar2 % 0x40) & 0x3f)) != 0) &&
                       (iVar5 = can2pty(pty,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40),
                       iVar5 != 0)) {
                      iVar10 = 0;
                    }
                  }
                  else {
                    iVar10 = 0;
                  }
                }
                else {
                  iVar10 = 0;
                }
              }
              close(__fd);
              close(iVar2);
              local_4 = 0;
            }
          }
        }
      }
      else {
        perror("tcgetattr");
        local_4 = 1;
      }
    }
  }
  else {
    __xpg_basename((char *)*in_RSI);
    print_usage(in_stack_fffffffffffffed0);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int p; /* pty master file */
	int s; /* can raw socket */
	struct sockaddr_can addr;
	struct termios topts;
	int select_stdin = 0;
	int running = 1;
	int tstamp = 0;
	int is_open = 0;
	struct can_filter fi;

	/* check command line options */
	if (argc != 3) {
		print_usage(basename(argv[0]));
		return 1;
	}

	select_stdin = check_select_stdin();

	/* open pty */
	p = open(argv[1], O_RDWR);
	if (p < 0) {
		perror("open pty");
		return 1;
	}

	if (tcgetattr(p, &topts)) {
		perror("tcgetattr");
		return 1;
	}

	/* disable local echo which would cause double frames */
	topts.c_lflag &= ~(ICANON | ECHO | ECHOE | ECHOK | ECHONL | ECHOPRT | ECHOKE);
	topts.c_iflag &= ~(ICRNL);
	topts.c_iflag |= INLCR;
	tcsetattr(p, TCSANOW, &topts);

	/* Support for the Unix 98 pseudo-terminal interface /dev/ptmx /dev/pts/N */
	if (strcmp(argv[1], DEVICE_NAME_PTMX) == 0) {
		char *name_pts = NULL; /* slave pseudo-terminal device name */

		if (grantpt(p) < 0) {
			perror("grantpt");
			return 1;
		}

		if (unlockpt(p) < 0) {
			perror("unlockpt");
			return 1;
		}

		name_pts = ptsname(p);
		if (name_pts == NULL) {
			perror("ptsname");
			return 1;
		}
		printf("open: %s: slave pseudo-terminal is %s\n", argv[1], name_pts);
	}

	/* open socket */
	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[2]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	/* disable reception of CAN frames until we are opened by 'O' */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	/* open filter by default */
	fi.can_id = 0;
	fi.can_mask = 0;

	while (running) {
		FD_ZERO(&rdfs);

		if (select_stdin)
			FD_SET(0, &rdfs);

		FD_SET(p, &rdfs);
		FD_SET(s, &rdfs);

		if (select(s + 1, &rdfs, NULL, NULL, NULL) < 0) {
			perror("select");
			return 1;
		}

		if (FD_ISSET(0, &rdfs)) {
			running = 0;
			continue;
		}

		if (FD_ISSET(p, &rdfs))
			if (pty2can(p, s, &fi, &is_open, &tstamp)) {
				running = 0;
				continue;
			}

		if (FD_ISSET(s, &rdfs))
			if (can2pty(p, s, &tstamp)) {
				running = 0;
				continue;
			}
	}

	close(p);
	close(s);

	return 0;
}